

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O1

RK_S32 mpi_dec_opt_bufmode(void *ctx,char *next)

{
  char *pcVar1;
  
  if (next == (char *)0x0) {
    _mpp_log_l(2,"mpi_dec_utils","invalid ext buf mode value\n",0);
    return 0;
  }
  pcVar1 = strstr(next,"hi");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = strchr(next,0x69);
    if (pcVar1 != (char *)0x0) {
      *(undefined4 *)((long)ctx + 0x230) = 1;
      return 1;
    }
    pcVar1 = strchr(next,0x65);
    if (pcVar1 != (char *)0x0) {
      *(undefined4 *)((long)ctx + 0x230) = 2;
      return 1;
    }
  }
  *(undefined4 *)((long)ctx + 0x230) = 0;
  return 1;
}

Assistant:

RK_S32 mpi_dec_opt_bufmode(void *ctx, const char *next)
{
    MpiDecTestCmd *cmd = (MpiDecTestCmd *)ctx;

    if (next) {
        if (strstr(next, "hi")) {
            cmd->buf_mode = MPP_DEC_BUF_HALF_INT;
        } else if (strstr(next, "i")) {
            cmd->buf_mode = MPP_DEC_BUF_INTERNAL;
        } else if (strstr(next, "e")) {
            cmd->buf_mode = MPP_DEC_BUF_EXTERNAL;
        } else {
            cmd->buf_mode = MPP_DEC_BUF_HALF_INT;
        }

        return 1;
    }

    mpp_err("invalid ext buf mode value\n");
    return 0;
}